

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cxx
# Opt level: O0

void __thiscall
cmsys::CommandLineArguments::AddArgument
          (CommandLineArguments *this,char *argument,ArgumentTypeEnum type,VariableTypeEnum vtype,
          void *variable,char *help)

{
  Internal *pIVar1;
  mapped_type *__dest;
  String local_88;
  char *local_68;
  CommandLineArgumentsCallbackStructure s;
  char *help_local;
  void *variable_local;
  VariableTypeEnum vtype_local;
  ArgumentTypeEnum type_local;
  char *argument_local;
  CommandLineArguments *this_local;
  
  s.ArgumentType = 0;
  s._12_4_ = 0;
  s.Callback = (CallbackType)0x0;
  pIVar1 = this->Internals;
  local_68 = argument;
  s.Argument._0_4_ = type;
  s.CallData = variable;
  s.Variable._0_4_ = vtype;
  s._40_8_ = help;
  s.Help = help;
  String::String(&local_88,argument);
  __dest = std::
           map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
           ::operator[](&(pIVar1->Callbacks).
                         super_map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
                        ,&local_88);
  memcpy(__dest,&local_68,0x38);
  String::~String(&local_88);
  GenerateHelp(this);
  return;
}

Assistant:

void CommandLineArguments::AddArgument(const char* argument,
                                       ArgumentTypeEnum type,
                                       VariableTypeEnum vtype, void* variable,
                                       const char* help)
{
  CommandLineArgumentsCallbackStructure s;
  s.Argument = argument;
  s.ArgumentType = type;
  s.Callback = nullptr;
  s.CallData = nullptr;
  s.VariableType = vtype;
  s.Variable = variable;
  s.Help = help;

  this->Internals->Callbacks[argument] = s;
  this->GenerateHelp();
}